

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeSetVersion(Btree *pBtree,int iVersion)

{
  BtShared *pBVar1;
  u8 *puVar2;
  u8 uVar3;
  int iVar4;
  
  uVar3 = (u8)iVersion;
  pBVar1 = pBtree->pBt;
  pBVar1->btsFlags = (ushort)(iVersion == 1) << 5 | pBVar1->btsFlags & 0xffdf;
  iVar4 = sqlite3BtreeBeginTrans(pBtree,0);
  if (iVar4 == 0) {
    puVar2 = pBVar1->pPage1->aData;
    if ((puVar2[0x12] != uVar3) || (iVar4 = 0, puVar2[0x13] != puVar2[0x12])) {
      iVar4 = sqlite3BtreeBeginTrans(pBtree,2);
      if (iVar4 == 0) {
        iVar4 = sqlite3PagerWrite(pBVar1->pPage1->pDbPage);
        if (iVar4 == 0) {
          puVar2[0x12] = uVar3;
          puVar2[0x13] = uVar3;
          iVar4 = 0;
        }
      }
    }
  }
  *(byte *)&pBVar1->btsFlags = (byte)pBVar1->btsFlags & 0xdf;
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetVersion(Btree *pBtree, int iVersion){
  BtShared *pBt = pBtree->pBt;
  int rc;                         /* Return code */
 
  assert( iVersion==1 || iVersion==2 );

  /* If setting the version fields to 1, do not automatically open the
  ** WAL connection, even if the version fields are currently set to 2.
  */
  pBt->btsFlags &= ~BTS_NO_WAL;
  if( iVersion==1 ) pBt->btsFlags |= BTS_NO_WAL;

  rc = sqlite3BtreeBeginTrans(pBtree, 0);
  if( rc==SQLITE_OK ){
    u8 *aData = pBt->pPage1->aData;
    if( aData[18]!=(u8)iVersion || aData[19]!=(u8)iVersion ){
      rc = sqlite3BtreeBeginTrans(pBtree, 2);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          aData[18] = (u8)iVersion;
          aData[19] = (u8)iVersion;
        }
      }
    }
  }

  pBt->btsFlags &= ~BTS_NO_WAL;
  return rc;
}